

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::outputAggRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset,bool postLoop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  string *psVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong *puVar9;
  size_type *psVar10;
  undefined8 *puVar11;
  ulong uVar12;
  char cVar13;
  char cVar14;
  undefined8 uVar15;
  ulong uVar16;
  bool bVar17;
  string __str_5;
  string k;
  string __str;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  bitset<7UL> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  CppGenerator *local_48;
  long local_40;
  size_t local_38;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  local_a0 = __return_storage_ptr__;
  local_70 = increasing;
  local_48 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar8 = numOfAggs + 1;
  local_38 = numOfAggs;
  if (uVar8 < 3) {
    if (uVar8 == 0) {
      return local_a0;
    }
    local_40 = stringOffset * 3;
    paVar1 = &local_c0.field_2;
    uVar8 = 0;
    do {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      if (postLoop) {
        std::__cxx11::string::_M_construct((ulong)&local_68,(char)local_40);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_e0._M_string_length = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        uVar16 = idx->indexes[7] + uVar8;
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar13 = '\x04';
          do {
            cVar14 = cVar13;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024b806;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024b806;
            }
            if (uVar12 < 10000) goto LAB_0024b806;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar13 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024b806:
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar16);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar15 = local_e0.field_2._M_allocated_capacity;
        }
        uVar16 = CONCAT44(local_98._M_string_length._4_4_,(uint)local_98._M_string_length) +
                 local_e0._M_string_length;
        if ((ulong)uVar15 < uVar16) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar15 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < uVar16) goto LAB_0024b888;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_98,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
        }
        else {
LAB_0024b888:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
        }
        local_100 = &local_f0;
        puVar11 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar7[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar7;
        }
        local_f8 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)puVar11 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = plVar6[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_c0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
      }
      else {
        std::__cxx11::string::_M_construct((ulong)&local_68,(char)local_40);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        puVar9 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_e0._M_string_length = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        uVar16 = idx->indexes[7] + uVar8;
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar13 = '\x04';
          do {
            cVar14 = cVar13;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024b952;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024b952;
            }
            if (uVar12 < 10000) goto LAB_0024b952;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar13 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024b952:
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar16);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar15 = local_e0.field_2._M_allocated_capacity;
        }
        uVar16 = CONCAT44(local_98._M_string_length._4_4_,(uint)local_98._M_string_length) +
                 local_e0._M_string_length;
        if ((ulong)uVar15 < uVar16) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar15 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < uVar16) goto LAB_0024b9d4;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_98,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
        }
        else {
LAB_0024b9d4:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
        }
        local_100 = &local_f0;
        puVar11 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar7[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar7;
        }
        local_f8 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c0._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      uVar16 = (idx->present).super__Base_bitset<1UL>._M_w;
      if ((uVar16 & 1) != 0) {
        uVar16 = (-(ulong)((uint)(local_70->super__Base_bitset<1UL>)._M_w & 1) & uVar8) +
                 idx->indexes[0];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar13 = '\x04';
          do {
            cVar14 = cVar13;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024bb73;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024bb73;
            }
            if (uVar12 < 10000) goto LAB_0024bb73;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar13 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024bb73:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b0ad7);
        local_100 = &local_f0;
        puVar11 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar7[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar7;
        }
        local_f8 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c0._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        uVar16 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar16 & 2) != 0) {
        uVar16 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & uVar8) +
                 idx->indexes[1];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar13 = '\x04';
          do {
            cVar14 = cVar13;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024bd10;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024bd10;
            }
            if (uVar12 < 10000) goto LAB_0024bd10;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar13 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024bd10:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b0af1);
        local_100 = &local_f0;
        puVar11 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar7[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar7;
        }
        local_f8 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c0._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        uVar16 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar16 & 4) != 0) {
        uVar16 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x3d) >> 0x3f & uVar8) +
                 idx->indexes[2];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar13 = '\x04';
          do {
            cVar14 = cVar13;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024bead;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024bead;
            }
            if (uVar12 < 10000) goto LAB_0024bead;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar13 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024bead:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b0b07);
        local_100 = &local_f0;
        puVar11 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar7[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar7;
        }
        local_f8 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c0._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        uVar16 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar16 & 8) != 0) {
        uVar16 = (local_70->super__Base_bitset<1UL>)._M_w;
        if ((uVar16 & 8) != 0) {
          std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
          goto LAB_0024d379;
        }
        uVar16 = ((long)(uVar16 << 0x3b) >> 0x3f & uVar8) + idx->indexes[4];
        std::operator+(&local_68,"aggregates_",local_48->viewName + idx->indexes[3]);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        puVar9 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_e0._M_string_length = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar13 = '\x04';
          do {
            cVar14 = cVar13;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024c0d7;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024c0d7;
            }
            if (uVar12 < 10000) goto LAB_0024c0d7;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar13 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024c0d7:
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar16);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar15 = local_e0.field_2._M_allocated_capacity;
        }
        uVar16 = CONCAT44(local_98._M_string_length._4_4_,(uint)local_98._M_string_length) +
                 local_e0._M_string_length;
        if ((ulong)uVar15 < uVar16) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar15 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < uVar16) goto LAB_0024c159;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_98,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
        }
        else {
LAB_0024c159:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
        }
        local_100 = &local_f0;
        puVar11 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar7[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar7;
        }
        local_f8 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c0._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        uVar16 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar16 & 0x20) != 0) {
        std::__cxx11::string::append((char *)local_a0);
        uVar16 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar16 & 0x40) != 0) {
        uVar16 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x39) >> 0x3f & uVar8) +
                 idx->indexes[6];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar13 = '\x04';
          do {
            cVar14 = cVar13;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024c311;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024c311;
            }
            if (uVar12 < 10000) goto LAB_0024c311;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar13 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024c311:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b0ad7);
        local_100 = &local_f0;
        puVar11 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar7[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar7;
        }
        local_f8 = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c0._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      psVar4 = local_a0;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)psVar4);
      bVar17 = uVar8 == local_38;
      uVar8 = uVar8 + 1;
      if (bVar17) {
        return local_a0;
      }
    } while( true );
  }
  cVar14 = (char)stringOffset * '\x03';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar14);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
  paVar1 = &local_e0.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_e0.field_2._M_allocated_capacity = *puVar9;
    local_e0.field_2._8_8_ = plVar6[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *puVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_e0._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar13 = '\x01';
  if (9 < uVar8) {
    uVar16 = uVar8;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (uVar16 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0024c4f1;
      }
      if (uVar16 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0024c4f1;
      }
      if (uVar16 < 10000) goto LAB_0024c4f1;
      bVar17 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar17);
    cVar13 = cVar13 + '\x01';
  }
LAB_0024c4f1:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_98,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar8);
  uVar8 = CONCAT44(local_98._M_string_length._4_4_,(uint)local_98._M_string_length) +
          local_e0._M_string_length;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    uVar15 = local_e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < uVar8) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar15 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar8) goto LAB_0024c567;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_98,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
  }
  else {
LAB_0024c567:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
  }
  local_100 = &local_f0;
  puVar11 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar11) {
    local_f0 = *puVar11;
    uStack_e8 = puVar7[3];
  }
  else {
    local_f0 = *puVar11;
    local_100 = (undefined8 *)*puVar7;
  }
  local_f8 = puVar7[1];
  *puVar7 = puVar11;
  puVar7[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  paVar2 = &local_c0.field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0.field_2._8_8_ = plVar6[3];
    local_c0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_c0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  cVar14 = cVar14 + '\x03';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  if (postLoop) {
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar14);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
    puVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0.field_2._8_8_ = puVar7[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_e0._M_string_length = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    uVar8 = idx->indexes[7];
    cVar14 = '\x01';
    if (9 < uVar8) {
      uVar16 = uVar8;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024c877;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024c877;
        }
        if (uVar16 < 10000) goto LAB_0024c877;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024c877:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar8);
    uVar8 = CONCAT44(local_98._M_string_length._4_4_,(uint)local_98._M_string_length) +
            local_e0._M_string_length;
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      uVar15 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar8) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar15 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < uVar8) goto LAB_0024c8ec;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
    }
    else {
LAB_0024c8ec:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
    }
    local_100 = &local_f0;
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar7[3];
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar7;
    }
    local_f8 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_c0.field_2._M_allocated_capacity = *psVar10;
      local_c0.field_2._8_8_ = puVar7[3];
      local_c0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar10;
      local_c0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_c0._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_100 == &local_f0) goto LAB_0024c9d6;
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar14);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
    puVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0.field_2._8_8_ = puVar7[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_e0._M_string_length = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    uVar8 = idx->indexes[7];
    cVar14 = '\x01';
    if (9 < uVar8) {
      uVar16 = uVar8;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024ca89;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024ca89;
        }
        if (uVar16 < 10000) goto LAB_0024ca89;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024ca89:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar8);
    uVar8 = CONCAT44(local_98._M_string_length._4_4_,(uint)local_98._M_string_length) +
            local_e0._M_string_length;
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      uVar15 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar8) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar15 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < uVar8) goto LAB_0024cafe;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
    }
    else {
LAB_0024cafe:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
    }
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar7[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar7;
    }
    local_f8 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_c0.field_2._M_allocated_capacity = *psVar10;
      local_c0.field_2._8_8_ = puVar7[3];
      local_c0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar10;
      local_c0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_c0._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_100 == &local_f0) goto LAB_0024c9d6;
  }
  operator_delete(local_100);
LAB_0024c9d6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  uVar8 = (idx->present).super__Base_bitset<1UL>._M_w;
  if ((uVar8 & 1) != 0) {
    uVar8 = idx->indexes[0];
    cVar14 = '\x01';
    if (9 < uVar8) {
      uVar16 = uVar8;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024cbe6;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024cbe6;
        }
        if (uVar16 < 10000) goto LAB_0024cbe6;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024cbe6:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar8);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 1) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"aggregateRegister[",&local_c0);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar7[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar7;
    }
    local_f8 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    uVar8 = (idx->present).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 2) != 0) {
    uVar8 = idx->indexes[1];
    cVar14 = '\x01';
    if (9 < uVar8) {
      uVar16 = uVar8;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024cd38;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024cd38;
        }
        if (uVar16 < 10000) goto LAB_0024cd38;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024cd38:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar8);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 2) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"localRegister[",&local_c0);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar7[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar7;
    }
    local_f8 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    uVar8 = (idx->present).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 4) != 0) {
    uVar8 = idx->indexes[2];
    cVar14 = '\x01';
    if (9 < uVar8) {
      uVar16 = uVar8;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024ce8a;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024ce8a;
        }
        if (uVar16 < 10000) goto LAB_0024ce8a;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024ce8a:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar8);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 4) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"viewRegister[",&local_c0);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar7[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar7;
    }
    local_f8 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    uVar8 = (idx->present).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 8) != 0) {
    if (((local_70->super__Base_bitset<1UL>)._M_w & 8) != 0) {
      std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
LAB_0024d379:
      exit(1);
    }
    uVar8 = idx->indexes[4];
    cVar14 = '\x01';
    if (9 < uVar8) {
      uVar16 = uVar8;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024cfed;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024cfed;
        }
        if (uVar16 < 10000) goto LAB_0024cfed;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024cfed:
    sVar3 = idx->indexes[3];
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar8);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 0x10) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_98,"aggregates_",local_48->viewName + sVar3);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_68.field_2._M_allocated_capacity = *psVar10;
      local_68.field_2._8_8_ = plVar6[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar10;
      local_68._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_68._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_c0._M_dataplus._M_p);
    puVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0.field_2._8_8_ = puVar7[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_e0._M_string_length = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar7[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar7;
    }
    local_f8 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    uVar8 = (idx->present).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 0x20) != 0) {
    std::__cxx11::string::append((char *)local_a0);
    uVar8 = (idx->present).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 0x40) != 0) {
    uVar8 = idx->indexes[6];
    cVar14 = '\x01';
    if (9 < uVar8) {
      uVar16 = uVar8;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024d251;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024d251;
        }
        if (uVar16 < 10000) goto LAB_0024d251;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024d251:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar8);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 0x40) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"aggregateRegister[",&local_c0);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar7[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar7;
    }
    local_f8 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  psVar4 = local_a0;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)psVar4);
  return local_a0;
}

Assistant:

std::string CppGenerator::outputAggRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset, bool postLoop)
{  
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";

        if (postLoop)
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] = ";
        else 
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] += ";

        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="localRegister["+k+"]*";
        }

        if (idx.present[2])
        {
            std::string k = std::to_string(idx.indexes[2]);
            if (increasing[2])
                k += "+i";
            outString +="viewRegister["+k+"]*";
        }
        if (idx.present[3])
        {
            // TODO: CHECK THAT index 4 is also presenth
            size_t viewID = idx.indexes[3];                
            if (increasing[3])
            {
                ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                exit(1);
            }
            
            std::string aggID = std::to_string(idx.indexes[4]);
            if (increasing[4])
                aggID += "+i";

            outString += "aggregates_"+viewName[viewID]+"["+aggID+"]*";
        }

        if (idx.present[5])
            outString +=  "count*";

        if (idx.present[6])
        {
            std::string k = std::to_string(idx.indexes[6]);            
            if (increasing[6])
                k += "+i";
            outString += "aggregateRegister["+k+"]*";
        }

        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            if (postLoop)
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] = ";
            else
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] += ";

            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="localRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[2])
            {
                size_t k = idx.indexes[2];
                if (increasing[2])
                    k += i;
                outString +="viewRegister["+std::to_string(k)+"]*";
            }
            if (idx.present[3])
            {
                // TODO: CHECK THAT index 4 is also presenth
                size_t viewID = idx.indexes[3];                
                if (increasing[3])
                {
                    ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                    exit(1);
                }

                size_t aggID = idx.indexes[4];
                if (increasing[4])
                    aggID += i;

                outString += "aggregates_"+viewName[viewID]+"["+
                    std::to_string(aggID)+"]*";
            }

            if (idx.present[5])
                outString +=  "count*";

            if (idx.present[6])
            {
                size_t k = idx.indexes[6];
                if (increasing[6])
                    k += i;
                outString += "aggregateRegister["+std::to_string(k)+"]*";
            }

            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}